

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
* GatherSamplers(unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                 *__return_storage_ptr__,Animation *anim)

{
  AnimationPath AVar1;
  undefined8 in_RAX;
  mapped_type *pmVar2;
  pointer pCVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 uStack_38;
  uint node_index;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  uVar4 = 0;
  _uStack_38 = in_RAX;
  while( true ) {
    uVar5 = (ulong)uVar4;
    pCVar3 = (anim->channels).
             super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(anim->channels).
                      super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 5) <= uVar5)
    break;
    if (pCVar3[uVar5].sampler <
        (int)(((long)(anim->samplers).
                     super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(anim->samplers).
                    super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      pCVar3 = pCVar3 + uVar5;
      _uStack_38 = CONCAT44((pCVar3->target).node.index,uStack_38);
      pmVar2 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)__return_storage_ptr__,&node_index);
      AVar1 = (pCVar3->target).path;
      if (AVar1 == AnimationPath_SCALE) {
        pmVar2->scale =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar3->sampler;
      }
      else if (AVar1 == AnimationPath_ROTATION) {
        pmVar2->rotation =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar3->sampler;
      }
      else if (AVar1 == AnimationPath_TRANSLATION) {
        pmVar2->translation =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar3->sampler;
      }
    }
    uVar4 = uVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<unsigned int, AnimationSamplers> GatherSamplers(Animation& anim)
{
    std::unordered_map<unsigned int, AnimationSamplers> samplers;
    for (unsigned int c = 0; c < anim.channels.size(); ++c) {
        Animation::Channel& channel = anim.channels[c];
        if (channel.sampler >= static_cast<int>(anim.samplers.size())) {
            continue;
        }

        const unsigned int node_index = channel.target.node.GetIndex();

        AnimationSamplers& sampler = samplers[node_index];
        if (channel.target.path == AnimationPath_TRANSLATION) {
            sampler.translation = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_ROTATION) {
            sampler.rotation = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_SCALE) {
            sampler.scale = &anim.samplers[channel.sampler];
        }
    }

    return samplers;
}